

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

bool __thiscall cppcms::xss::uri_parser::pct_encoded(uri_parser *this)

{
  bool bVar1;
  long in_RDI;
  bool local_1;
  
  if ((((*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10) < 3) ||
       (**(char **)(in_RDI + 0x10) != '%')) || (bVar1 = is_hex('\0'), !bVar1)) ||
     (bVar1 = is_hex('\0'), !bVar1)) {
    local_1 = false;
  }
  else {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 3;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool pct_encoded()
		{
			if(end_ - begin_ >=3 && begin_[0]=='%' && is_hex(begin_[1]) && is_hex(begin_[2])) {
				begin_+=3;
				return true;
			}
			return false;
		}